

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_ManFree(Dtt_Man_t *p)

{
  int *piVar1;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  long lVar2;
  long lVar3;
  
  if (p->vVisited != (Vec_Int_t *)0x0) {
    piVar1 = p->vVisited->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vVisited->pArray = (int *)0x0;
    }
    if (p->vVisited != (Vec_Int_t *)0x0) {
      free(p->vVisited);
      p->vVisited = (Vec_Int_t *)0x0;
    }
  }
  if (p->pTable != (uint *)0x0) {
    free(p->pTable);
    p->pTable = (uint *)0x0;
  }
  if (p->pNodes != (int *)0x0) {
    free(p->pNodes);
    p->pNodes = (int *)0x0;
  }
  if (p->pTimes != (int *)0x0) {
    free(p->pTimes);
    p->pTimes = (int *)0x0;
  }
  if (p->pVisited != (char *)0x0) {
    free(p->pVisited);
    p->pVisited = (char *)0x0;
  }
  if (p->vFanins != (Vec_Int_t *)0x0) {
    piVar1 = p->vFanins->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vFanins->pArray = (int *)0x0;
    }
    if (p->vFanins != (Vec_Int_t *)0x0) {
      free(p->vFanins);
      p->vFanins = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTruths != (Vec_Int_t *)0x0) {
    piVar1 = p->vTruths->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTruths->pArray = (int *)0x0;
    }
    if (p->vTruths != (Vec_Int_t *)0x0) {
      free(p->vTruths);
      p->vTruths = (Vec_Int_t *)0x0;
    }
  }
  if (p->vConfigs != (Vec_Int_t *)0x0) {
    piVar1 = p->vConfigs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vConfigs->pArray = (int *)0x0;
    }
    if (p->vConfigs != (Vec_Int_t *)0x0) {
      free(p->vConfigs);
      p->vConfigs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vClasses != (Vec_Int_t *)0x0) {
    piVar1 = p->vClasses->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vClasses->pArray = (int *)0x0;
    }
    if (p->vClasses != (Vec_Int_t *)0x0) {
      free(p->vClasses);
      p->vClasses = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTruthNpns != (Vec_Int_t *)0x0) {
    piVar1 = p->vTruthNpns->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTruthNpns->pArray = (int *)0x0;
    }
    if (p->vTruthNpns != (Vec_Int_t *)0x0) {
      free(p->vTruthNpns);
      p->vTruthNpns = (Vec_Int_t *)0x0;
    }
  }
  __ptr = p->vFunNodes;
  if (__ptr != (Vec_Wec_t *)0x0) {
    if (0 < __ptr->nCap) {
      lVar3 = 8;
      lVar2 = 0;
      do {
        __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar3);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          *(undefined8 *)((long)&__ptr->pArray->nCap + lVar3) = 0;
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar2 < __ptr->nCap);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
    p->vFunNodes = (Vec_Wec_t *)0x0;
  }
  if (p->vTemp != (Vec_Int_t *)0x0) {
    piVar1 = p->vTemp->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTemp->pArray = (int *)0x0;
    }
    if (p->vTemp != (Vec_Int_t *)0x0) {
      free(p->vTemp);
      p->vTemp = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTemp2 != (Vec_Int_t *)0x0) {
    piVar1 = p->vTemp2->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTemp2->pArray = (int *)0x0;
    }
    if (p->vTemp2 != (Vec_Int_t *)0x0) {
      free(p->vTemp2);
      p->vTemp2 = (Vec_Int_t *)0x0;
    }
  }
  if (p->vUsedBins != (Vec_Int_t *)0x0) {
    piVar1 = p->vUsedBins->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vUsedBins->pArray = (int *)0x0;
    }
    if (p->vUsedBins != (Vec_Int_t *)0x0) {
      free(p->vUsedBins);
      p->vUsedBins = (Vec_Int_t *)0x0;
    }
  }
  if (p->pPerms != (int *)0x0) {
    free(p->pPerms);
    p->pPerms = (int *)0x0;
  }
  if (p->pComps != (int *)0x0) {
    free(p->pComps);
    p->pComps = (int *)0x0;
  }
  if (p->pPres != (word *)0x0) {
    free(p->pPres);
    p->pPres = (word *)0x0;
  }
  if (p->pBins != (uint *)0x0) {
    free(p->pBins);
    p->pBins = (uint *)0x0;
  }
  if (p != (Dtt_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Dtt_ManFree( Dtt_Man_t * p )
{
    Vec_IntFreeP( &p->vVisited );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pNodes );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pVisited );
    Vec_IntFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vConfigs );
    Vec_IntFreeP( &p->vClasses );
    Vec_IntFreeP( &p->vTruthNpns );
    Vec_WecFreeP( &p->vFunNodes );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vTemp2 );
    Vec_IntFreeP( &p->vUsedBins );
    ABC_FREE( p->pPerms );
    ABC_FREE( p->pComps );
    ABC_FREE( p->pPres );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}